

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pce.c
# Opt level: O2

int pce_pack_16x16_tile(uchar *buffer,void *data,int line_offset,int format)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte local_4e;
  void *local_48;
  
  if (pass == 1) {
    buffer[0x70] = '\0';
    buffer[0x71] = '\0';
    buffer[0x72] = '\0';
    buffer[0x73] = '\0';
    buffer[0x74] = '\0';
    buffer[0x75] = '\0';
    buffer[0x76] = '\0';
    buffer[0x77] = '\0';
    buffer[0x78] = '\0';
    buffer[0x79] = '\0';
    buffer[0x7a] = '\0';
    buffer[0x7b] = '\0';
    buffer[0x7c] = '\0';
    buffer[0x7d] = '\0';
    buffer[0x7e] = '\0';
    buffer[0x7f] = '\0';
    buffer[0x60] = '\0';
    buffer[0x61] = '\0';
    buffer[0x62] = '\0';
    buffer[99] = '\0';
    buffer[100] = '\0';
    buffer[0x65] = '\0';
    buffer[0x66] = '\0';
    buffer[0x67] = '\0';
    buffer[0x68] = '\0';
    buffer[0x69] = '\0';
    buffer[0x6a] = '\0';
    buffer[0x6b] = '\0';
    buffer[0x6c] = '\0';
    buffer[0x6d] = '\0';
    buffer[0x6e] = '\0';
    buffer[0x6f] = '\0';
    buffer[0x50] = '\0';
    buffer[0x51] = '\0';
    buffer[0x52] = '\0';
    buffer[0x53] = '\0';
    buffer[0x54] = '\0';
    buffer[0x55] = '\0';
    buffer[0x56] = '\0';
    buffer[0x57] = '\0';
    buffer[0x58] = '\0';
    buffer[0x59] = '\0';
    buffer[0x5a] = '\0';
    buffer[0x5b] = '\0';
    buffer[0x5c] = '\0';
    buffer[0x5d] = '\0';
    buffer[0x5e] = '\0';
    buffer[0x5f] = '\0';
    buffer[0x40] = '\0';
    buffer[0x41] = '\0';
    buffer[0x42] = '\0';
    buffer[0x43] = '\0';
    buffer[0x44] = '\0';
    buffer[0x45] = '\0';
    buffer[0x46] = '\0';
    buffer[0x47] = '\0';
    buffer[0x48] = '\0';
    buffer[0x49] = '\0';
    buffer[0x4a] = '\0';
    buffer[0x4b] = '\0';
    buffer[0x4c] = '\0';
    buffer[0x4d] = '\0';
    buffer[0x4e] = '\0';
    buffer[0x4f] = '\0';
    buffer[0x30] = '\0';
    buffer[0x31] = '\0';
    buffer[0x32] = '\0';
    buffer[0x33] = '\0';
    buffer[0x34] = '\0';
    buffer[0x35] = '\0';
    buffer[0x36] = '\0';
    buffer[0x37] = '\0';
    buffer[0x38] = '\0';
    buffer[0x39] = '\0';
    buffer[0x3a] = '\0';
    buffer[0x3b] = '\0';
    buffer[0x3c] = '\0';
    buffer[0x3d] = '\0';
    buffer[0x3e] = '\0';
    buffer[0x3f] = '\0';
    buffer[0x20] = '\0';
    buffer[0x21] = '\0';
    buffer[0x22] = '\0';
    buffer[0x23] = '\0';
    buffer[0x24] = '\0';
    buffer[0x25] = '\0';
    buffer[0x26] = '\0';
    buffer[0x27] = '\0';
    buffer[0x28] = '\0';
    buffer[0x29] = '\0';
    buffer[0x2a] = '\0';
    buffer[0x2b] = '\0';
    buffer[0x2c] = '\0';
    buffer[0x2d] = '\0';
    buffer[0x2e] = '\0';
    buffer[0x2f] = '\0';
    buffer[0x10] = '\0';
    buffer[0x11] = '\0';
    buffer[0x12] = '\0';
    buffer[0x13] = '\0';
    buffer[0x14] = '\0';
    buffer[0x15] = '\0';
    buffer[0x16] = '\0';
    buffer[0x17] = '\0';
    buffer[0x18] = '\0';
    buffer[0x19] = '\0';
    buffer[0x1a] = '\0';
    buffer[0x1b] = '\0';
    buffer[0x1c] = '\0';
    buffer[0x1d] = '\0';
    buffer[0x1e] = '\0';
    buffer[0x1f] = '\0';
    buffer[0] = '\0';
    buffer[1] = '\0';
    buffer[2] = '\0';
    buffer[3] = '\0';
    buffer[4] = '\0';
    buffer[5] = '\0';
    buffer[6] = '\0';
    buffer[7] = '\0';
    buffer[8] = '\0';
    buffer[9] = '\0';
    buffer[10] = '\0';
    buffer[0xb] = '\0';
    buffer[0xc] = '\0';
    buffer[0xd] = '\0';
    buffer[0xe] = '\0';
    buffer[0xf] = '\0';
    if (format == 1) {
      iVar4 = 0;
      local_48 = data;
      for (iVar8 = 0; iVar8 != 0x10; iVar8 = iVar8 + 1) {
        local_4e = buffer[iVar4];
        bVar9 = buffer[(long)iVar4 + 1];
        bVar10 = buffer[(long)iVar4 + 0x10];
        bVar14 = buffer[(long)iVar4 + 0x11];
        bVar12 = buffer[(long)iVar4 + 0x20];
        bVar13 = buffer[(long)iVar4 + 0x21];
        bVar2 = buffer[(long)iVar4 + 0x30];
        bVar7 = buffer[(long)iVar4 + 0x31];
        for (uVar5 = 0; uVar5 != 8; uVar5 = uVar5 + 1) {
          bVar1 = *(byte *)((long)local_48 + ((ulong)uVar5 ^ 7));
          bVar6 = (byte)(1 << ((byte)uVar5 & 0x1f));
          bVar11 = bVar1 & 1;
          if ((bVar1 & 1) != 0) {
            bVar11 = bVar6;
          }
          local_4e = local_4e | bVar11;
          bVar11 = bVar1 & 2;
          if ((bVar1 & 2) != 0) {
            bVar11 = bVar6;
          }
          buffer[iVar4] = local_4e;
          bVar9 = bVar9 | bVar11;
          buffer[(long)iVar4 + 1] = bVar9;
          bVar11 = bVar1 & 4;
          if ((bVar1 & 4) != 0) {
            bVar11 = bVar6;
          }
          bVar10 = bVar10 | bVar11;
          buffer[(long)iVar4 + 0x10] = bVar10;
          bVar11 = bVar1 & 8;
          if ((bVar1 & 8) != 0) {
            bVar11 = bVar6;
          }
          bVar14 = bVar14 | bVar11;
          buffer[(long)iVar4 + 0x11] = bVar14;
          bVar1 = *(byte *)((long)local_48 + ((ulong)uVar5 ^ 0xf));
          bVar11 = bVar1 & 1;
          if ((bVar1 & 1) != 0) {
            bVar11 = bVar6;
          }
          bVar12 = bVar12 | bVar11;
          buffer[(long)iVar4 + 0x20] = bVar12;
          bVar11 = bVar1 & 2;
          if ((bVar1 & 2) != 0) {
            bVar11 = bVar6;
          }
          bVar13 = bVar13 | bVar11;
          buffer[(long)iVar4 + 0x21] = bVar13;
          bVar11 = bVar1 & 4;
          if ((bVar1 & 4) != 0) {
            bVar11 = bVar6;
          }
          bVar2 = bVar2 | bVar11;
          bVar11 = bVar1 & 8;
          if ((bVar1 & 8) != 0) {
            bVar11 = bVar6;
          }
          buffer[(long)iVar4 + 0x30] = bVar2;
          bVar7 = bVar7 | bVar11;
          buffer[(long)iVar4 + 0x31] = bVar7;
        }
        iVar3 = iVar4 + 0x30;
        if (iVar8 != 7) {
          iVar3 = iVar4;
        }
        local_48 = (void *)((long)local_48 + (long)line_offset);
        iVar4 = iVar3 + 2;
      }
    }
    else {
      error("Internal error: unsupported format passed to \'pack_16x16_tile\'!");
    }
  }
  return 0x80;
}

Assistant:

int
pce_pack_16x16_tile(unsigned char *buffer, void *data, int line_offset, int format)
{
	int i, j;
	int cnt;
	unsigned int   pixel, mask;
	unsigned char *ptr;

	/* pack the tile only in the last pass */
	if (pass != LAST_PASS)
		return (128);

	/* clear buffer */
	memset(buffer, 0, 128);

	/* encode the tile */
	switch (format) {
	case CHUNKY_TILE:
		/* 8-bit chunky format - from a pcx */
		cnt = 0;
		ptr = (unsigned char *)data;

		for (i = 0; i < 16; i++) {
			for (j = 0; j < 8; j++) {
				pixel = ptr[j ^ 0x07];
				mask  = 1 << j;
				buffer[cnt]    |= (pixel & 0x01) ? mask : 0;
				buffer[cnt+1]  |= (pixel & 0x02) ? mask : 0;
				buffer[cnt+16] |= (pixel & 0x04) ? mask : 0;
				buffer[cnt+17] |= (pixel & 0x08) ? mask : 0;

				pixel = ptr[(j + 8) ^ 0x07];
				buffer[cnt+32] |= (pixel & 0x01) ? mask : 0;
				buffer[cnt+33] |= (pixel & 0x02) ? mask : 0;
				buffer[cnt+48] |= (pixel & 0x04) ? mask : 0;
				buffer[cnt+49] |= (pixel & 0x08) ? mask : 0;
			}				
			if (i == 7)
				cnt += 48;
			ptr += line_offset;
			cnt += 2;
		}
		break;

	default:
		/* other formats not supported */
		error("Internal error: unsupported format passed to 'pack_16x16_tile'!");
		break;
	}

	/* ok */
	return (128);
}